

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

void __thiscall Assimp::ColladaParser::ReadScene(ColladaParser *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *__s;
  iterator iVar4;
  allocator<char> local_99;
  key_type local_98;
  _Base_ptr local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined4 extraout_var;
  
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((char)iVar2 == '\0') {
    local_78 = &(this->mNodeLibrary)._M_t._M_impl.super__Rb_tree_header._M_header;
    do {
      while( true ) {
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
        if ((char)iVar2 == '\0') {
          return;
        }
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar2 != 1) break;
        bVar1 = IsElement(this,"instance_visual_scene");
        if (bVar1) {
          if (this->mRootNode != (Node *)0x0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_98,
                       "Invalid scene containing multiple root nodes in <instance_visual_scene> element"
                       ,(allocator<char> *)&local_70);
            ThrowException(this,&local_98);
          }
          uVar3 = GetAttribute(this,"url");
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
          __s = (char *)CONCAT44(extraout_var,iVar2);
          if (*__s != '#') {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_98,
                       "Unknown reference format in <instance_visual_scene> element",
                       (allocator<char> *)&local_70);
            ThrowException(this,&local_98);
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_98,__s + 1,(allocator<char> *)&local_70);
          iVar4 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Node_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Node_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Node_*>_>_>
                  ::find(&(this->mNodeLibrary)._M_t,&local_98);
          std::__cxx11::string::~string((string *)&local_98);
          if (iVar4._M_node == local_78) {
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_99);
            std::operator+(&local_70,"Unable to resolve visual_scene reference \"",&local_50);
            std::operator+(&local_98,&local_70,"\" in <instance_visual_scene> element.");
            ThrowException(this,&local_98);
          }
          this->mRootNode = *(Node **)(iVar4._M_node + 2);
        }
        else {
          SkipElement(this);
        }
      }
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    } while (iVar2 != 2);
  }
  return;
}

Assistant:

void ColladaParser::ReadScene()
{
    if (mReader->isEmptyElement())
        return;

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT) {
            if (IsElement("instance_visual_scene"))
            {
                // should be the first and only occurrence
                if (mRootNode)
                    ThrowException("Invalid scene containing multiple root nodes in <instance_visual_scene> element");

                // read the url of the scene to instance. Should be of format "#some_name"
                int urlIndex = GetAttribute("url");
                const char* url = mReader->getAttributeValue(urlIndex);
                if (url[0] != '#')
                    ThrowException("Unknown reference format in <instance_visual_scene> element");

                // find the referred scene, skip the leading #
                NodeLibrary::const_iterator sit = mNodeLibrary.find(url + 1);
                if (sit == mNodeLibrary.end())
                    ThrowException("Unable to resolve visual_scene reference \"" + std::string(url) + "\" in <instance_visual_scene> element.");
                mRootNode = sit->second;
            }
            else {
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
            break;
        }
    }
}